

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableArgumentsArrayWalker::FetchFormalsAddress
          (RecyclableArgumentsArrayWalker *this,LocalsWalker *localsWalker)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  FunctionBody *this_00;
  PropertyIdOnRegSlotsContainer *pPVar5;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  PropertyIdArray *pPVar6;
  DiagStackFrame *pDVar7;
  uint32 i;
  ulong uVar8;
  IDiagObjectAddress *local_40;
  IDiagObjectAddress *address;
  bool isConst;
  
  if (localsWalker == (LocalsWalker *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc38,"(localsWalker)","localsWalker");
    if (!bVar2) goto LAB_007ee802;
    *puVar4 = 0;
  }
  pDVar7 = localsWalker->pFrame;
  if (pDVar7 == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc39,"(localsWalker->pFrame)","localsWalker->pFrame");
    if (!bVar2) goto LAB_007ee802;
    *puVar4 = 0;
    pDVar7 = localsWalker->pFrame;
  }
  iVar3 = (*pDVar7->_vptr_DiagStackFrame[2])();
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc3b,"(pFBody)","pFBody");
    if (!bVar2) {
LAB_007ee802:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pPVar5 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                     ((FunctionProxy *)this_00);
  if ((pPVar5 != (PropertyIdOnRegSlotsContainer *)0x0) &&
     (pPVar6 = (pPVar5->propertyIdsForFormalArgs).ptr, pPVar6 != (PropertyIdArray *)0x0)) {
    for (uVar8 = 0; uVar8 < pPVar6->count; uVar8 = uVar8 + 1) {
      if ((&pPVar6[1].count)[uVar8] != 0xffffffff) {
        address._7_1_ = 0;
        local_40 = LocalsWalker::FindPropertyAddress
                             (localsWalker,(&pPVar6[1].count)[uVar8],false,
                              (bool *)((long)&address + 7));
        if (local_40 != (IDiagObjectAddress *)0x0) {
          this_01 = this->pFormalsList;
          if (this_01 ==
              (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)0x0) {
            alloc = GetArenaFromContext((this->super_RecyclableArrayWalker).
                                        super_RecyclableObjectWalker.scriptContext);
            this_01 = JsUtil::
                      List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::New(alloc,4);
            this->pFormalsList = this_01;
          }
          JsUtil::
          List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this_01,&local_40);
        }
        pPVar6 = (pPVar5->propertyIdsForFormalArgs).ptr;
      }
    }
  }
  return;
}

Assistant:

void RecyclableArgumentsArrayWalker::FetchFormalsAddress(LocalsWalker * localsWalker)
    {
        Assert(localsWalker);
        Assert(localsWalker->pFrame);
        Js::FunctionBody *pFBody = localsWalker->pFrame->GetJavascriptFunction()->GetFunctionBody();
        Assert(pFBody);

        PropertyIdOnRegSlotsContainer * container = pFBody->GetPropertyIdOnRegSlotsContainer();
        if (container &&  container->propertyIdsForFormalArgs)
        {
            for (uint32 i = 0; i < container->propertyIdsForFormalArgs->count; i++)
            {
                if (container->propertyIdsForFormalArgs->elements[i] != Js::Constants::NoRegister)
                {
                    bool isConst = false;
                    IDiagObjectAddress * address = localsWalker->FindPropertyAddress(container->propertyIdsForFormalArgs->elements[i], false, isConst);
                    if (address)
                    {
                        if (pFormalsList == nullptr)
                        {
                            pFormalsList = JsUtil::List<IDiagObjectAddress *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
                        }

                        pFormalsList->Add(address);
                    }
                }
            }
        }
    }